

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_sra_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t fVar1;
  undefined1 auVar2 [16];
  short sVar3;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar4 [16];
  short sVar12;
  undefined1 auVar5 [16];
  undefined1 auVar13 [16];
  
  fVar1 = (env->active_fpu).fpr[ws];
  auVar4 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],0xc);
  auVar13 = psraw(auVar4,0xf);
  auVar2 = psraw((undefined1  [16])fVar1,8);
  auVar2 = auVar2 & auVar13 | ~auVar13 & (undefined1  [16])fVar1;
  sVar3 = auVar4._0_2_;
  sVar6 = auVar4._2_2_;
  auVar13._2_2_ = sVar6 * 2;
  auVar13._0_2_ = sVar3 * 2;
  sVar7 = auVar4._4_2_;
  auVar13._4_2_ = sVar7 * 2;
  sVar8 = auVar4._6_2_;
  auVar13._6_2_ = sVar8 * 2;
  sVar9 = auVar4._8_2_;
  auVar13._8_2_ = sVar9 * 2;
  sVar10 = auVar4._10_2_;
  auVar13._10_2_ = sVar10 * 2;
  sVar11 = auVar4._12_2_;
  sVar12 = auVar4._14_2_;
  auVar13._12_2_ = sVar11 * 2;
  auVar13._14_2_ = sVar12 * 2;
  auVar13 = psraw(auVar13,0xf);
  auVar4 = psraw(auVar2,4);
  auVar2 = auVar4 & auVar13 | ~auVar13 & auVar2;
  auVar4._2_2_ = sVar6 * 4;
  auVar4._0_2_ = sVar3 * 4;
  auVar4._4_2_ = sVar7 * 4;
  auVar4._6_2_ = sVar8 * 4;
  auVar4._8_2_ = sVar9 * 4;
  auVar4._10_2_ = sVar10 * 4;
  auVar4._12_2_ = sVar11 * 4;
  auVar4._14_2_ = sVar12 * 4;
  auVar13 = psraw(auVar4,0xf);
  auVar4 = psraw(auVar2,2);
  auVar2 = auVar4 & auVar13 | ~auVar13 & auVar2;
  auVar5._2_2_ = sVar6 << 3;
  auVar5._0_2_ = sVar3 << 3;
  auVar5._4_2_ = sVar7 << 3;
  auVar5._6_2_ = sVar8 << 3;
  auVar5._8_2_ = sVar9 << 3;
  auVar5._10_2_ = sVar10 << 3;
  auVar5._12_2_ = sVar11 << 3;
  auVar5._14_2_ = sVar12 << 3;
  auVar13 = psraw(auVar5,0xf);
  auVar4 = psraw(auVar2,1);
  (env->active_fpu).fpr[wd] = (fpr_t)(auVar4 & auVar13 | ~auVar13 & auVar2);
  return;
}

Assistant:

void helper_msa_sra_h(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_sra_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_sra_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_sra_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_sra_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_sra_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_sra_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_sra_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_sra_df(DF_HALF, pws->h[7],  pwt->h[7]);
}